

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmarks.c
# Opt level: O0

void evaluate(Benchmarks *bench,Arguments *args)

{
  long lVar1;
  uint uVar2;
  bench_t bVar3;
  long lVar4;
  ulong uVar5;
  uint *in_RSI;
  long *in_RDI;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int messageRate;
  double sigma;
  double average;
  bench_t total_time;
  undefined4 uVar14;
  
  if (0 < (int)in_RSI[1]) {
    bVar3 = now();
    lVar4 = bVar3 - *in_RDI;
    lVar1 = in_RDI[4];
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    dVar6 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / (double)(int)in_RSI[1]
    ;
    uVar5 = (ulong)in_RDI[5] / (ulong)(long)(int)in_RSI[1];
    auVar9._8_4_ = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = 0x45300000;
    dVar7 = sqrt(((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) - dVar6 * dVar6);
    uVar2 = in_RSI[1];
    uVar14 = (undefined4)((ulong)lVar4 >> 0x20);
    auVar13._8_4_ = uVar14;
    auVar13._0_8_ = lVar4;
    auVar13._12_4_ = 0x45300000;
    printf("\n============ RESULTS ================\n");
    printf("Message size:       %d\n",(ulong)*in_RSI);
    printf("Message count:      %d\n",(ulong)in_RSI[1]);
    auVar10._8_4_ = uVar14;
    auVar10._0_8_ = lVar4;
    auVar10._12_4_ = 0x45300000;
    printf("Total duration:     %.3f\tms\n",
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) / 1000000.0);
    printf("Average duration:   %.3f\tus\n",dVar6 / 1000.0);
    lVar1 = in_RDI[2];
    auVar11._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar11._0_8_ = lVar1;
    auVar11._12_4_ = 0x45300000;
    printf("Minimum duration:   %.3f\tus\n",
           ((auVar11._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0);
    lVar1 = in_RDI[3];
    auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar12._0_8_ = lVar1;
    auVar12._12_4_ = 0x45300000;
    printf("Maximum duration:   %.3f\tus\n",
           ((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 1000.0);
    printf("Standard deviation: %.3f\tus\n",dVar7 / 1000.0);
    printf("Message rate:       %d\tmsg/s\n",
           (ulong)(uint)(int)((double)(int)uVar2 /
                             (((auVar13._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) /
                             1000000000.0)));
    printf("=====================================\n");
    return;
  }
  __assert_fail("args->count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/goldsborough[P]ipc-bench/source/common/benchmarks.c"
                ,0x2f,"void evaluate(Benchmarks *, Arguments *)");
}

Assistant:

void evaluate(Benchmarks* bench, Arguments* args) {
	assert(args->count > 0);
	const bench_t total_time = now() - bench->total_start;
	const double average = ((double)bench->sum) / args->count;

	double sigma = bench->squared_sum / args->count;
	sigma = sqrt(sigma - (average * average));

	int messageRate = (int)(args->count / (total_time / 1e9));

	printf("\n============ RESULTS ================\n");
	printf("Message size:       %d\n", args->size);
	printf("Message count:      %d\n", args->count);
	printf("Total duration:     %.3f\tms\n", total_time / 1e6);
	printf("Average duration:   %.3f\tus\n", average / 1000.0);
	printf("Minimum duration:   %.3f\tus\n", bench->minimum / 1000.0);
	printf("Maximum duration:   %.3f\tus\n", bench->maximum / 1000.0);
	printf("Standard deviation: %.3f\tus\n", sigma / 1000.0);
	printf("Message rate:       %d\tmsg/s\n", messageRate);
	printf("=====================================\n");
}